

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_addmul_v_s256_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [32];
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  block_t *Ablock;
  block_t *vblock;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  
  auVar5 = vpbroadcastq_avx512vl();
  auVar6 = vpsllvq_avx2(auVar5,_DAT_0017c670);
  auVar6 = vpsraq_avx512vl(auVar6,0x3f);
  auVar12 = vpermq_avx2(ZEXT1632(auVar6),0x50);
  auVar11 = vpternlogq_avx512vl(auVar12,ZEXT1632(*(undefined1 (*) [16])c->w64),
                                *(undefined1 (*) [32])A->w64,0x6c);
  auVar6 = vpsllvq_avx2(auVar5,_DAT_0017c680);
  auVar6 = vpsraq_avx512vl(auVar6,0x3f);
  auVar12 = vpermq_avx2(ZEXT1632(auVar6),0x50);
  auVar12 = vpand_avx2(auVar12,*(undefined1 (*) [32])A[1].w64);
  lVar4 = 0x40;
  auVar13._8_8_ = 0x8080808003020100;
  auVar13._0_8_ = 0x8080808003020100;
  auVar6 = vpmovsxbq_avx(ZEXT216(0x3c3d));
  auVar5 = vpmovsxbq_avx(ZEXT216(0x3a3b));
  auVar10 = vpmovsxbq_avx(ZEXT216(0x3839));
  uVar2 = v->w64[1] >> 0x26;
  do {
    uVar3 = uVar2;
    auVar7 = vpbroadcastq_avx512vl();
    auVar8 = vpshufb_avx(ZEXT416((uint)uVar3 & 1),auVar13);
    auVar9 = vpsubq_avx((undefined1  [16])0x0,auVar8);
    auVar8 = vpsraq_avx512vl(auVar7,0x3f);
    auVar8 = vpshufd_avx(auVar8,0xee);
    auVar15._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar9;
    auVar15._16_16_ = ZEXT116(1) * auVar8;
    auVar9 = vpbroadcastq_avx512vl();
    auVar8 = vpsllvq_avx2(auVar9,auVar6);
    auVar8 = vpsraq_avx512vl(auVar8,0x3f);
    auVar14 = vpermq_avx2(ZEXT1632(auVar8),0x50);
    auVar8 = vpsllvq_avx2(auVar9,auVar5);
    auVar8 = vpsraq_avx512vl(auVar8,0x3f);
    auVar1 = vpermq_avx2(ZEXT1632(auVar8),0x50);
    auVar11 = vpternlogq_avx512vl(auVar11,auVar15,*(undefined1 (*) [32])((long)A->w64 + lVar4),0x78)
    ;
    auVar11 = vpternlogq_avx512vl(auVar11,auVar1,*(undefined1 (*) [32])((long)A[2].w64 + lVar4),0x78
                                 );
    auVar8 = vpsllvq_avx2(auVar9,auVar10);
    auVar8 = vpsraq_avx512vl(auVar8,0x3f);
    auVar1 = vpermq_avx2(ZEXT1632(auVar8),0x50);
    auVar12 = vpternlogq_avx512vl(auVar12,auVar14,*(undefined1 (*) [32])((long)A[1].w64 + lVar4),
                                  0x78);
    auVar12 = vpternlogq_avx512vl(auVar12,auVar1,*(undefined1 (*) [32])((long)A[3].w64 + lVar4),0x78
                                 );
    lVar4 = lVar4 + 0x80;
    uVar2 = uVar3 >> 8;
  } while ((int)lVar4 != 0x1c0);
  auVar6 = vpbroadcastq_avx512vl();
  auVar10 = vpsraq_avx512vl(auVar6,0x3f);
  auVar6 = vpshufb_avx(ZEXT416((uint)(uVar3 >> 8) & 1),_DAT_0017c630);
  auVar5 = vpsubq_avx((undefined1  [16])0x0,auVar6);
  auVar6 = vpshufd_avx(auVar10,0xee);
  auVar14._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar5;
  auVar14._16_16_ = ZEXT116(1) * auVar6;
  auVar14 = vpand_avx2(auVar14,*(undefined1 (*) [32])A[0xe].w64);
  auVar12 = vpternlogq_avx512vl(auVar11,auVar12,auVar14,0x96);
  *(undefined1 (*) [16])c->w64 = auVar12._0_16_ ^ auVar12._16_16_;
  return;
}

Assistant:

ATTR_TARGET_AVX2
void mzd_addmul_v_s256_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* vblock = CONST_BLOCK(v, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);
  word idx              = vblock->w64[1] >> 34;

  word256 cval[2];
  cval[0] = mm256_xor_mask(_mm256_setr_m128i(mm128_load(cblock->w64), mm128_zero),
                           mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
  cval[1] = mm256_and(mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
  idx >>= 4;
  Ablock += 2;

  for (unsigned int i = 24; i; i -= 8, idx >>= 8, Ablock += 4) {
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[1].w64), mm256_compute_mask_2(idx, 2));
    cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[2].w64), mm256_compute_mask_2(idx, 4));
    cval[1] = mm256_xor_mask(cval[1], mm256_load(Ablock[3].w64), mm256_compute_mask_2(idx, 6));
  }
  cval[0] = mm256_xor_mask(cval[0], mm256_load(Ablock[0].w64), mm256_compute_mask_2(idx, 0));

  cval[0] = mm256_xor(cval[0], cval[1]);
  mm128_store(cblock->w64, mm128_xor(_mm256_extractf128_si256(cval[0], 0),
                                     _mm256_extractf128_si256(cval[0], 1)));
}